

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontal.cpp
# Opt level: O1

void __thiscall
cppurses::layout::Horizontal::collect_space
          (Horizontal *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int width_left)

{
  pointer *ppDVar1;
  size_t sVar2;
  Type TVar3;
  pointer pDVar4;
  ulong uVar5;
  bool bVar6;
  _Map_pointer ppuVar7;
  _Elt_pointer puVar8;
  _Elt_pointer puVar9;
  _Map_pointer ppuVar10;
  _Map_pointer ppuVar11;
  iterator __begin2;
  pointer pDVar12;
  int iVar13;
  _Elt_pointer puVar14;
  long lVar15;
  ulong uVar16;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  pointer pDVar17;
  pointer pDVar18;
  Dimensions_reference *d_2;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> width_deductions;
  double local_f8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  double local_98;
  double dStack_90;
  double local_80;
  pointer local_78;
  ulong local_70;
  Horizontal *local_68;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  if (width_left != 0) {
    pDVar12 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pDVar4 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_f8 = 0.0;
    local_98 = 0.0;
    dStack_90 = 0.0;
    if (pDVar12 != pDVar4) {
      lVar15 = 0;
      pDVar18 = pDVar12;
      do {
        TVar3 = (pDVar18->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
          lVar15 = lVar15 + (pDVar18->widget->width_policy).stretch_;
        }
        pDVar18 = pDVar18 + 1;
      } while (pDVar18 != pDVar4);
      auVar21._8_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar21._0_8_ = lVar15;
      auVar21._12_4_ = 0x45300000;
      dStack_90 = auVar21._8_8_ - 1.9342813113834067e+25;
      local_98 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
    }
    if (pDVar12 != pDVar4) {
      local_f8 = 0.0;
      do {
        TVar3 = (pDVar12->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
          sVar2 = (pDVar12->widget->width_policy).stretch_;
          local_f8 = local_f8 +
                     1.0 / ((((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                           local_98);
        }
        pDVar12 = pDVar12 + 1;
      } while (pDVar12 != pDVar4);
    }
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
    iVar13 = 0;
    local_68 = this;
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_e8,0);
    pDVar12 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    bVar19 = pDVar12 == local_78;
    if (!bVar19) {
      local_80 = (double)-width_left;
      do {
        TVar3 = (pDVar12->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
          sVar2 = (pDVar12->widget->width_policy).stretch_;
          auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)sVar2);
          auVar22._8_4_ = (int)(sVar2 >> 0x20);
          auVar22._12_4_ = 0x45300000;
          dVar20 = ((1.0 / (((auVar22._8_8_ - 1.9342813113834067e+25) +
                            (auVar22._0_8_ - 4503599627370496.0)) / local_98)) / local_f8) *
                   local_80;
          local_70 = (ulong)dVar20;
          local_70 = (long)(dVar20 - 9.223372036854776e+18) & (long)local_70 >> 0x3f | local_70;
          if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_push_back_aux<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,&local_70);
          }
          else {
            *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70;
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          uVar5 = *pDVar12->width;
          puVar14 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar14 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar16 = (pDVar12->widget->width_policy).min_;
          if (uVar16 <= uVar5 - puVar14[-1]) goto LAB_00143767;
          *pDVar12->width = uVar16;
          pDVar4 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pDVar18 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pDVar17 = pDVar4 + (long)iVar13 + 1;
          if (pDVar17 != pDVar18) {
            memmove(pDVar4 + iVar13,pDVar17,(long)pDVar18 - (long)pDVar17);
          }
          ppDVar1 = &(widgets->
                     super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + -1;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector(&local_48,widgets);
          width_left = width_left + ((int)uVar5 - (int)uVar16);
          collect_space(local_68,&local_48,width_left);
          if (local_48.
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = false;
        }
        else {
LAB_00143767:
          iVar13 = iVar13 + 1;
          bVar6 = true;
        }
        if (!bVar6) break;
        pDVar12 = pDVar12 + 1;
        bVar19 = pDVar12 == local_78;
      } while (!bVar19);
    }
    if (bVar19) {
      pDVar12 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pDVar12 != pDVar4) {
        do {
          TVar3 = (pDVar12->widget->width_policy).type_;
          if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
            uVar5 = *pDVar12->width;
            uVar16 = uVar5 - *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (uVar5 < *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              uVar16 = 0;
            }
            *pDVar12->width = uVar16;
            width_left = width_left + (int)*local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
          }
          pDVar12 = pDVar12 + 1;
        } while (pDVar12 != pDVar4);
      }
      ppuVar11 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppuVar10 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
      puVar9 = local_e8._M_impl.super__Deque_impl_data._M_start._M_last;
      puVar8 = local_e8._M_impl.super__Deque_impl_data._M_start._M_first;
      puVar14 = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (width_left != 0) {
        pDVar12 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pDVar4 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_f8 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        if (pDVar12 != pDVar4) {
          lVar15 = 0;
          pDVar18 = pDVar12;
          do {
            if ((pDVar18->widget->width_policy).type_ == Expanding) {
              lVar15 = lVar15 + (pDVar18->widget->width_policy).stretch_;
            }
            pDVar18 = pDVar18 + 1;
          } while (pDVar18 != pDVar4);
          auVar23._8_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar23._0_8_ = lVar15;
          auVar23._12_4_ = 0x45300000;
          dStack_90 = auVar23._8_8_ - 1.9342813113834067e+25;
          local_98 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
        }
        ppuVar7 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
        if (pDVar12 != pDVar4) {
          local_f8 = 0.0;
          do {
            if ((pDVar12->widget->width_policy).type_ == Expanding) {
              sVar2 = (pDVar12->widget->width_policy).stretch_;
              local_f8 = local_f8 +
                         1.0 / ((((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) -
                                 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                               local_98);
            }
            pDVar12 = pDVar12 + 1;
          } while (pDVar12 != pDVar4);
        }
        for (; ppuVar7 < ppuVar11; ppuVar7 = ppuVar7 + 1) {
          operator_delete(ppuVar7[1],0x200);
        }
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar14;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = puVar8;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = puVar9;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = ppuVar10;
        pDVar12 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_78 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        bVar19 = pDVar12 == local_78;
        if (!bVar19) {
          local_80 = (double)-width_left;
          iVar13 = 0;
          do {
            if ((pDVar12->widget->width_policy).type_ == Expanding) {
              sVar2 = (pDVar12->widget->width_policy).stretch_;
              auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)sVar2);
              auVar24._8_4_ = (int)(sVar2 >> 0x20);
              auVar24._12_4_ = 0x45300000;
              dVar20 = ((1.0 / (((auVar24._8_8_ - 1.9342813113834067e+25) +
                                (auVar24._0_8_ - 4503599627370496.0)) / local_98)) / local_f8) *
                       local_80;
              local_70 = (ulong)dVar20;
              local_70 = (long)(dVar20 - 9.223372036854776e+18) & (long)local_70 >> 0x3f | local_70;
              if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_push_back_aux<unsigned_long>
                          ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                           &local_70);
              }
              else {
                *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70;
                local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar5 = *pDVar12->width;
              puVar14 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                puVar14 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              uVar16 = (pDVar12->widget->width_policy).min_;
              if (uVar16 <= uVar5 - puVar14[-1]) goto LAB_00143b2f;
              *pDVar12->width = uVar16;
              pDVar4 = (widgets->
                       super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pDVar18 = (widgets->
                        super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pDVar17 = pDVar4 + (long)iVar13 + 1;
              if (pDVar17 != pDVar18) {
                memmove(pDVar4 + iVar13,pDVar17,(long)pDVar18 - (long)pDVar17);
              }
              ppDVar1 = &(widgets->
                         super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppDVar1 = *ppDVar1 + -1;
              std::
              vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              ::vector(&local_60,widgets);
              width_left = width_left + ((int)uVar5 - (int)uVar16);
              collect_space(local_68,&local_60,width_left);
              if (local_60.
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              bVar6 = false;
            }
            else {
LAB_00143b2f:
              iVar13 = iVar13 + 1;
              bVar6 = true;
            }
            if (!bVar6) break;
            pDVar12 = pDVar12 + 1;
            bVar19 = pDVar12 == local_78;
          } while (!bVar19);
        }
        if (bVar19) {
          pDVar12 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pDVar4 = (widgets->
                   super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pDVar12 != pDVar4) {
            do {
              if ((pDVar12->widget->width_policy).type_ == Expanding) {
                uVar5 = *pDVar12->width;
                uVar16 = uVar5 - *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
                if (uVar5 < *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  uVar16 = 0;
                }
                *pDVar12->width = uVar16;
                if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
                    local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
                  operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
                  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                       local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
                  local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
                       local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
                  local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
                       local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
                  local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
                       local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
                }
                else {
                  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
                       local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
                }
              }
              pDVar12 = pDVar12 + 1;
            } while (pDVar12 != pDVar4);
          }
        }
      }
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_e8);
  }
  return;
}

Assistant:

void Horizontal::collect_space(std::vector<Dimensions_reference> widgets,
                               int width_left) {
    if (width_left == 0) {
        return;
    }
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    double total_inverse{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go under min_width
    // then assign min value and recurse without that widget in vector.
    std::deque<std::size_t> width_deductions;
    int index{0};
    auto to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    if (width_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    total_inverse = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    width_deductions.clear();
    index = 0;
    to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }
    // Change this to distribute the space, it might not be too small
    if (width_left != 0) {
        return;
    }
}